

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_io.c
# Opt level: O0

int CVodeGetQuadNumErrTestFails(void *cvode_mem,long *nQetfails)

{
  long *in_RSI;
  CVodeMem in_RDI;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x77d,"CVodeGetQuadNumErrTestFails",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_io.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->cv_quadr == 0) {
    cvProcessError(in_RDI,-0x1e,0x785,"CVodeGetQuadNumErrTestFails",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_io.c"
                   ,"Quadrature integration not activated.");
    local_4 = -0x1e;
  }
  else {
    *in_RSI = in_RDI->cv_netfQ;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeGetQuadNumErrTestFails(void* cvode_mem, long int* nQetfails)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  if (cv_mem->cv_quadr == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_QUAD, __LINE__, __func__, __FILE__,
                   MSGCV_NO_QUAD);
    return (CV_NO_QUAD);
  }

  *nQetfails = cv_mem->cv_netfQ;

  return (CV_SUCCESS);
}